

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMDisassembler.c
# Opt level: O3

DecodeStatus DecodeVLD3DupInstruction(MCInst *Inst,uint Insn,uint64_t Address,void *Decoder)

{
  uint Register;
  int iVar1;
  uint uVar2;
  uint uVar3;
  uint local_38;
  
  uVar3 = Insn >> 0x12 & 0x10 | Insn >> 0xc & 0xf;
  uVar2 = Insn & 0xf;
  local_38 = 0;
  iVar1 = ((Insn >> 5 & 1) != 0) + 1;
  MCOperand_CreateReg0(Inst,(uint)DPRDecoderTable[uVar3]);
  MCOperand_CreateReg0(Inst,(uint)DPRDecoderTable[uVar3 + iVar1 & 0x1f]);
  MCOperand_CreateReg0(Inst,(uint)DPRDecoderTable[uVar3 + iVar1 * 2 & 0x1f]);
  uVar3 = (uint)*(ushort *)((long)GPRDecoderTable + (ulong)(Insn >> 0xf & 0x1e));
  if (uVar2 != 0xf) {
    MCOperand_CreateReg0(Inst,uVar3);
  }
  MCOperand_CreateReg0(Inst,uVar3);
  MCOperand_CreateImm0(Inst,0);
  if (uVar2 != 0xd) {
    if (uVar2 == 0xf) {
      return MCDisassembler_Success;
    }
    local_38 = (uint)GPRDecoderTable[uVar2];
  }
  MCOperand_CreateReg0(Inst,local_38);
  return MCDisassembler_Success;
}

Assistant:

static DecodeStatus DecodeVLD3DupInstruction(MCInst *Inst, unsigned Insn,
		uint64_t Address, const void *Decoder)
{
	DecodeStatus S = MCDisassembler_Success;
	unsigned Rn, Rm, inc;
	unsigned Rd = fieldFromInstruction_4(Insn, 12, 4);
	Rd |= fieldFromInstruction_4(Insn, 22, 1) << 4;
	Rn = fieldFromInstruction_4(Insn, 16, 4);
	Rm = fieldFromInstruction_4(Insn, 0, 4);
	inc = fieldFromInstruction_4(Insn, 5, 1) + 1;

	if (!Check(&S, DecodeDPRRegisterClass(Inst, Rd, Address, Decoder)))
		return MCDisassembler_Fail;
	if (!Check(&S, DecodeDPRRegisterClass(Inst, (Rd+inc)%32, Address, Decoder)))
		return MCDisassembler_Fail;
	if (!Check(&S, DecodeDPRRegisterClass(Inst, (Rd+2*inc)%32, Address, Decoder)))
		return MCDisassembler_Fail;
	if (Rm != 0xF) {
		if (!Check(&S, DecodeGPRRegisterClass(Inst, Rn, Address, Decoder)))
			return MCDisassembler_Fail;
	}

	if (!Check(&S, DecodeGPRRegisterClass(Inst, Rn, Address, Decoder)))
		return MCDisassembler_Fail;
	MCOperand_CreateImm0(Inst, 0);

	if (Rm == 0xD)
		MCOperand_CreateReg0(Inst, 0);
	else if (Rm != 0xF) {
		if (!Check(&S, DecodeGPRRegisterClass(Inst, Rm, Address, Decoder)))
			return MCDisassembler_Fail;
	}

	return S;
}